

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

void __thiscall
pstore::index::details::internal_node::insert_child
          (internal_node *this,hash_type hash,index_pointer leaf,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  size_t offset;
  span<pstore::index::details::index_pointer,__1L> sVar4;
  span<pstore::index::details::index_pointer,__1L> sVar5;
  span<pstore::index::details::index_pointer,__1L> span;
  span<pstore::index::details::index_pointer,__1L> d_span;
  span<pstore::index::details::index_pointer,__1L> children_span;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_f0;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_e0;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_d0;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_c0;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_b0;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_a0;
  span<pstore::index::details::index_pointer,__1L> local_90;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_80;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_70;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_40;
  
  uVar1 = 1L << ((byte)hash & 0x3f);
  uVar3 = this->bitmap_;
  if ((uVar3 >> (hash & 0x3f) & 1) != 0) {
    assert_failed("(this->bitmap_ & bit_pos) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x133);
  }
  if (uVar3 == 0xffffffffffffffff) {
    assert_failed("old_size < hash_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x138);
  }
  offset = POPCOUNT(uVar1 - 1 & uVar3);
  uVar2 = (uint)POPCOUNT(uVar3);
  if (uVar2 < (uint)offset) {
    assert_failed("index <= old_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x139);
  }
  local_90.storage_.data_ = this->children_;
  local_90.storage_.super_extent_type<_1L>.size_ = 0x40;
  uVar3 = (ulong)(uVar2 - (uint)offset);
  local_f0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             gsl::span<pstore::index::details::index_pointer,_-1L>::subspan(&local_90,offset,uVar3);
  local_e0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             gsl::span<pstore::index::details::index_pointer,_-1L>::subspan
                       (&local_90,offset + 1,uVar3);
  sVar4 = gsl::span<pstore::index::details::index_pointer,_-1L>::last
                    ((span<pstore::index::details::index_pointer,__1L> *)&local_e0,0);
  sVar5 = gsl::span<pstore::index::details::index_pointer,_-1L>::last(&local_90,0);
  if (sVar4.storage_.data_ <= sVar5.storage_.data_) {
    gsl::details::
    span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::
    span_iterator(&local_a0,(span<pstore::index::details::index_pointer,__1L> *)&local_f0,0);
    gsl::details::
    span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::
    span_iterator(&local_b0,(span<pstore::index::details::index_pointer,__1L> *)&local_f0,
                  local_f0.super_extent_type<_1L>.size_);
    gsl::details::
    span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::
    span_iterator(&local_c0,(span<pstore::index::details::index_pointer,__1L> *)&local_e0,
                  local_e0.super_extent_type<_1L>.size_);
    gsl::details::
    span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::
    span_iterator(&local_50,local_a0.span_,local_a0.index_);
    gsl::details::
    span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::
    span_iterator(&local_40,local_50.span_,local_50.index_);
    gsl::details::
    span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::
    span_iterator(&local_70,local_b0.span_,local_b0.index_);
    gsl::details::
    span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::
    span_iterator(&local_60,local_70.span_,local_70.index_);
    gsl::details::
    span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::
    span_iterator(&local_80,local_c0.span_,local_c0.index_);
    std::
    __copy_move_backward_a<true,pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_1l>,false>,pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_1l>,false>>
              (&local_d0,&local_40,&local_60);
    this->children_[offset] = leaf;
    uVar1 = uVar1 | this->bitmap_;
    this->bitmap_ = uVar1;
    if (uVar2 + 1 != (int)POPCOUNT(uVar1)) {
      assert_failed("bit_count::pop_count (this->bitmap_) == old_size + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                    ,0x14a);
    }
    uVar3 = (parents.ptr_)->elements_;
    if (uVar3 < 0xd) {
      (parents.ptr_)->elements_ = uVar3 + 1;
      ((parents.ptr_)->c_)._M_elems[uVar3].node.internal_ = (internal_node *)((ulong)this | 3);
      ((parents.ptr_)->c_)._M_elems[uVar3].position = offset;
      return;
    }
    assert_failed("elements_ < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                  ,100);
  }
  assert_failed("d_span.last (0).data () <= children_span.last (0).data ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                ,0x142);
}

Assistant:

void internal_node::insert_child (hash_type const hash, index_pointer const leaf,
                                              gsl::not_null<parent_stack *> const parents) {
                auto const hash_index = hash & details::hash_index_mask;
                auto const bit_pos = hash_type{1} << hash_index;
                PSTORE_ASSERT (bit_pos != 0); // guarantee that we didn't shift the bit to oblivion
                // check that this slot is free.
                PSTORE_ASSERT ((this->bitmap_ & bit_pos) ==
                               0); //! OCLINT(PH - bitwise in conditional)

                // Compute the child index by counting the number of 1 bits below bit_pos.
                unsigned const index = bit_count::pop_count (this->bitmap_ & (bit_pos - 1));
                unsigned const old_size = bit_count::pop_count (this->bitmap_);
                PSTORE_ASSERT (old_size < hash_size);
                PSTORE_ASSERT (index <= old_size);

                // Move elements from [index..old_size) to [index+1..old_size+1)
                {
                    auto const children_span = gsl::make_span (&children_[0], hash_size);
                    auto const num_to_move = old_size - index;

                    auto const span = children_span.subspan (index, num_to_move);
                    auto const d_span = children_span.subspan (index + 1, num_to_move);
                    PSTORE_ASSERT (d_span.last (0).data () <= children_span.last (0).data ());

                    std::move_backward (std::begin (span), std::end (span), std::end (d_span));
                }

                children_[index] = leaf;

                this->bitmap_ = this->bitmap_ | bit_pos;
                PSTORE_ASSERT (bit_count::pop_count (this->bitmap_) == old_size + 1);
                parents->push (parent_type{index_pointer{this}, index});
            }